

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1444.cpp
# Opt level: O3

int comp(void *v1,void *v2)

{
  uint uVar1;
  long lVar2;
  point *p2;
  long lVar3;
  point *p1;
  double dVar4;
  
  dVar4 = *(double *)((long)v1 + 0x10) - *(double *)((long)v2 + 0x10);
  uVar1 = 1;
  if ((dVar4 <= 1e-10) && (uVar1 = 0xffffffff, -1e-10 <= dVar4)) {
    lVar2 = *(long *)((long)v1 + 8) - p[0].y;
    lVar3 = *(long *)((long)v2 + 8) - p[0].y;
    uVar1 = ((ulong)(lVar3 * lVar3 + (*v2 - p[0].x) * (*v2 - p[0].x)) <
            (ulong)(lVar2 * lVar2 + (*v1 - p[0].x) * (*v1 - p[0].x))) - 1 | 1;
  }
  return uVar1;
}

Assistant:

int comp(const void *v1, const void *v2) {
    const point *p1 = (point *) v1;
    const point *p2 = (point *) v2;
    if (p1->angle - p2->angle > 1e-10) {
        return 1;
    } else if (p1->angle - p2->angle < -1e-10) {
        return -1;
    } else {
        if ((p1->x - p[0].x) * (p1->x - p[0].x) + (p1->y - p[0].y) * (p1->y - p[0].y) >
            (p2->x - p[0].x) * (p2->x - p[0].x) + (p2->y - p[0].y) * (p2->y - p[0].y)) {
            return 1;
        } else {
            return -1;
        }
    }
}